

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

void __thiscall
imrt::EvaluationFunction::undo_last_eval
          (EvaluationFunction *this,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  bool bVar1;
  reference ppVar2;
  reference pvVar3;
  reference pvVar4;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *in_RDI;
  double prev_Dok;
  int k;
  int o;
  pair<std::pair<int,_int>,_double> z;
  iterator __end1;
  iterator __begin1;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *__range1;
  vector<double,_std::allocator<double>_> *in_stack_00000068;
  EvaluationFunction *in_stack_00000070;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *in_stack_ffffffffffffff98;
  double dVar5;
  int local_48;
  int iStack_44;
  _Self local_38;
  _Self local_30;
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *local_28;
  
  local_28 = in_RDI + 0xf;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
       ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppVar2 = std::_List_iterator<std::pair<std::pair<int,_int>,_double>_>::operator*
                       ((_List_iterator<std::pair<std::pair<int,_int>,_double>_> *)0x123dbd);
    dVar5 = ppVar2->second;
    local_48 = (ppVar2->first).first;
    iStack_44 = (ppVar2->first).second;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&(in_RDI->
                              super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                              )._M_impl._M_node._M_size,(long)local_48);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)iStack_44);
    *pvVar4 = *pvVar4 - dVar5;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0xe),(long)local_48);
    std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(long)iStack_44);
    update_sorted_voxels
              (in_stack_00000070,in_stack_00000068,(vector<double,_std::allocator<double>_> *)this,w
               ,Zmin._4_4_,(int)Zmin);
    std::_List_iterator<std::pair<std::pair<int,_int>,_double>_>::operator++(&local_30);
  }
  in_RDI[4].
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)
       in_RDI[4].
       super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
       ._M_impl._M_node._M_size;
  in_RDI[4].
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node._M_size =
       (size_t)in_RDI[4].
               super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev;
  std::__cxx11::
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ::clear(in_RDI);
  return;
}

Assistant:

void EvaluationFunction::undo_last_eval(vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax){

	for(auto z:Z_diff){
		int o=z.first.first;
		int k=z.first.second;
		Z[o][k]-=z.second;

		double prev_Dok=D[o][k];
		update_sorted_voxels(w, Zmin, Zmax, o, k);
		//update_beamlets_impact(o, k, prev_Dok);
	}
	F=prev_F;
	prev_F=F; Z_diff.clear();
}